

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  MutexType *pMVar1;
  bool bVar2;
  reference ppSVar3;
  DFA *this_00;
  long lVar4;
  Mutex *local_e8;
  int local_9c;
  DFA *pDStack_98;
  int i;
  State *s;
  new_allocator<char> local_79;
  DFA *local_78;
  char *space;
  int local_68;
  int mem;
  int nnext;
  int kStateCacheOverhead;
  key_type local_58;
  _Node_iterator_base<re2::DFA::State_*,_true> local_50;
  iterator it;
  State state;
  uint32_t flag_local;
  int ninst_local;
  int *inst_local;
  DFA *this_local;
  
  State::State((State *)&it);
  local_58 = (key_type)&it;
  it.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur =
       (_Node_iterator_base<re2::DFA::State_*,_true>)
       (_Node_iterator_base<re2::DFA::State_*,_true>)inst;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::find(&this->state_cache_,&local_58);
  _nnext = (__node_type *)
           std::
           unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
           ::end(&this->state_cache_);
  bVar2 = std::__detail::operator==
                    (&local_50,(_Node_iterator_base<re2::DFA::State_*,_true> *)&nnext);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    mem = 0x28;
    local_68 = Prog::bytemap_range(this->prog_);
    local_68 = local_68 + 1;
    space._4_4_ = local_68 * 8 + 0x10 + ninst * 4;
    if (this->mem_budget_ < (long)(space._4_4_ + 0x28)) {
      this->mem_budget_ = -1;
      this_local = (DFA *)0x0;
    }
    else {
      this->mem_budget_ = this->mem_budget_ - (long)(space._4_4_ + 0x28);
      std::allocator<char>::allocator();
      this_00 = (DFA *)__gnu_cxx::new_allocator<char>::allocate
                                 (&local_79,(long)space._4_4_,(void *)0x0);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      local_78 = this_00;
      State::State((State *)this_00);
      lVar4 = (long)local_68;
      local_e8 = &this_00->mutex_;
      pDStack_98 = this_00;
      if (lVar4 != 0) {
        pMVar1 = &local_e8->mutex_;
        do {
          std::atomic<re2::DFA::State_*>::atomic((atomic<re2::DFA::State_*> *)local_e8);
          local_e8 = (Mutex *)((long)&local_e8->mutex_ + 8);
        } while (local_e8 != (Mutex *)((long)pMVar1 + lVar4 * 8));
      }
      for (local_9c = 0; local_9c < local_68; local_9c = local_9c + 1) {
        std::atomic<re2::DFA::State_*>::atomic
                  ((atomic<re2::DFA::State_*> *)
                   ((long)&(pDStack_98->mutex_).mutex_ + (long)local_9c * 8),(__pointer_type)0x0);
      }
      pDStack_98->prog_ = (Prog *)((long)&(pDStack_98->mutex_).mutex_ + (long)local_68 * 8);
      memmove(pDStack_98->prog_,inst,(long)ninst << 2);
      pDStack_98->kind_ = ninst;
      *(uint32_t *)&pDStack_98->init_failed_ = flag;
      std::
      unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
      ::insert(&this->state_cache_,(value_type *)&stack0xffffffffffffff68);
      this_local = pDStack_98;
    }
  }
  else {
    ppSVar3 = std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
                        ((_Node_iterator<re2::DFA::State_*,_true,_true> *)&local_50);
    this_local = (DFA *)*ppSVar3;
  }
  return (State *)this_local;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (ExtraDebug)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (ExtraDebug)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}